

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::InitFrom
          (EpsCopyInputStream *this,ZeroCopyInputStream *zcis,int limit)

{
  long lVar1;
  int *piVar2;
  int in_EDX;
  EpsCopyInputStream *in_RSI;
  long *in_RDI;
  char *res;
  int local_2c;
  char *local_28;
  undefined4 in_stack_ffffffffffffffe0;
  char *local_8;
  
  if (in_EDX == -1) {
    local_8 = InitFrom(in_RSI,(ZeroCopyInputStream *)CONCAT44(0xffffffff,in_stack_ffffffffffffffe0))
    ;
  }
  else {
    *(int *)((long)in_RDI + 0x54) = in_EDX;
    local_28 = InitFrom(in_RSI,(ZeroCopyInputStream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
    *(int *)((long)in_RDI + 0x1c) = in_EDX - ((int)in_RDI[1] - (int)local_28);
    lVar1 = in_RDI[1];
    local_2c = 0;
    piVar2 = std::min<int>(&local_2c,(int *)((long)in_RDI + 0x1c));
    *in_RDI = lVar1 + *piVar2;
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

const char* InitFrom(io::ZeroCopyInputStream* zcis, int limit) {
    if (limit == -1) return InitFrom(zcis);
    overall_limit_ = limit;
    auto res = InitFrom(zcis);
    limit_ = limit - static_cast<int>(buffer_end_ - res);
    limit_end_ = buffer_end_ + (std::min)(0, limit_);
    return res;
  }